

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

bool __thiscall OSToken::setUserPIN(OSToken *this,ByteString *userPINBlob)

{
  byte bVar1;
  long *in_RDI;
  CK_ULONG flags;
  OSAttribute userPIN;
  OSAttribute *this_00;
  ByteString *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  undefined5 in_stack_ffffffffffffff43;
  OSAttribute local_b8;
  byte local_1;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_1 = 0;
  }
  else {
    this_00 = &local_b8;
    OSAttribute::OSAttribute
              ((OSAttribute *)
               CONCAT53(in_stack_ffffffffffffff43,
                        CONCAT12(in_stack_ffffffffffffff42,
                                 CONCAT11(in_stack_ffffffffffffff41,in_stack_ffffffffffffff40))),
               in_stack_ffffffffffffff38);
    bVar1 = (**(code **)(*(long *)in_RDI[0x18] + 0x40))((long *)in_RDI[0x18],0x8000534d,this_00);
    if (((bVar1 & 1) == 0) ||
       (bVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,&stack0xffffffffffffff40), (bVar1 & 1) == 0)) {
      local_1 = 0;
    }
    else {
      local_1 = (**(code **)(*in_RDI + 0x28))
                          (in_RDI,CONCAT53(in_stack_ffffffffffffff43,
                                           CONCAT12(in_stack_ffffffffffffff42,
                                                    CONCAT11(in_stack_ffffffffffffff41,
                                                             in_stack_ffffffffffffff40))) &
                                  0xfffffffffff0ffff | 8);
      local_1 = local_1 & 1;
    }
    OSAttribute::~OSAttribute(this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSToken::setUserPIN(ByteString userPINBlob)
{
	if (!valid) return false;

	OSAttribute userPIN(userPINBlob);

	CK_ULONG flags;

	if (tokenObject->setAttribute(CKA_OS_USERPIN, userPIN) &&
	    getTokenFlags(flags))
	{
		flags |= CKF_USER_PIN_INITIALIZED;
		flags &= ~CKF_USER_PIN_COUNT_LOW;
		flags &= ~CKF_USER_PIN_FINAL_TRY;
		flags &= ~CKF_USER_PIN_LOCKED;
		flags &= ~CKF_USER_PIN_TO_BE_CHANGED;

		return setTokenFlags(flags);
	}

	return false;
}